

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O3

void __thiscall OSTEI_Writer::WriteShellOffsets(OSTEI_Writer *this)

{
  ostream *poVar1;
  OSTEI_HRR_Algorithm_Base *this_00;
  _Base_ptr p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  string local_d8;
  string local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [24];
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_60;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"// calculate the shell offsets\n",0x1f)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"// these are the offset from the shell pointed to by cd\n",0x38);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"// for each element\n",0x14);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"int shelloffsets[SIMINT_SIMD_LEN] = {0};\n",0x29);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"int lastoffset = 0;\n",0x14);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "const int nlane = ( ((j + SIMINT_SIMD_LEN) < jend) ? SIMINT_SIMD_LEN : (jend - j));\n"
             ,0x54);
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"if((iprimcd + SIMINT_SIMD_LEN) >= nprim_icd)\n",0x2d);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent6_abi_cxx11_._M_dataplus._M_p,
                      indent6_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"// Handle if the first element of the vector is a new shell\n",0x3c);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent6_abi_cxx11_._M_dataplus._M_p,
                      indent6_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"if(iprimcd >= nprim_icd && ((icd+1) < nshellbatch))\n",0x34);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent6_abi_cxx11_._M_dataplus._M_p,
                      indent6_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent7_abi_cxx11_._M_dataplus._M_p,
                      indent7_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"nprim_icd += Q.nprim12[cd + (++icd)];\n",0x26);
  this_00 = OSTEI_HRR_Writer::Algo((this->super_OSTEI_Writer_Base).hrr_writer_);
  OSTEI_HRR_Algorithm_Base::TopAM((QAMSet *)&local_60,this_00);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent7_abi_cxx11_._M_dataplus._M_p,
                          indent7_abi_cxx11_._M_string_length);
      local_d8.field_2._M_allocated_capacity = 0x5254505f4d495250;
      local_d8._M_string_length = 8;
      local_d8.field_2._M_local_buf[8] = '\0';
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      ArrVarName(&local_b8,(QAM *)(p_Var2 + 1),&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," += ",4);
      local_98 = *(undefined8 *)(((QAM *)(p_Var2 + 1))->qam)._M_elems;
      uStack_90 = p_Var2[1]._M_parent;
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,p_Var2[1]._M_left,
                 (long)&(p_Var2[1]._M_left)->_M_color + (long)&(p_Var2[1]._M_right)->_M_color);
      auVar3._0_4_ = (int)local_98 + 2;
      auVar3._4_4_ = local_98._4_4_ + 2;
      auVar3._8_4_ = (int)uStack_90 + 2;
      auVar3._12_4_ = uStack_90._4_4_ + 2;
      auVar4._4_4_ = local_98._4_4_ + 1;
      auVar4._12_4_ = uStack_90._4_4_ + 1;
      auVar4._0_4_ = auVar4._4_4_;
      auVar4._8_4_ = auVar4._12_4_;
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar1,
                          (~((int)uStack_90 >> 0x1f) &
                          (uint)((auVar3._8_8_ & 0xffffffff) * (ulong)((int)uStack_90 + 1)) >> 1) *
                          (~((int)local_98 >> 0x1f) &
                          (uint)(auVar3._0_4_ * ((int)local_98 + 1)) >> 1) *
                          (~(local_98._4_4_ >> 0x1f) & (uint)(auVar4._4_4_ * auVar3._4_4_) >> 1) *
                          (~(uStack_90._4_4_ >> 0x1f) &
                          (uint)((auVar4._8_8_ & 0xffffffff) * (ulong)auVar3._12_4_) >> 1));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_60);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent6_abi_cxx11_._M_dataplus._M_p,
                      indent6_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}\n",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent6_abi_cxx11_._M_dataplus._M_p,
                      indent6_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"iprimcd++;\n",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent6_abi_cxx11_._M_dataplus._M_p,
                      indent6_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"for(n = 1; n < SIMINT_SIMD_LEN; ++n)\n",0x25);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent6_abi_cxx11_._M_dataplus._M_p,
                      indent6_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent7_abi_cxx11_._M_dataplus._M_p,
                      indent7_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"if(iprimcd >= nprim_icd && ((icd+1) < nshellbatch))\n",0x34);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent7_abi_cxx11_._M_dataplus._M_p,
                      indent7_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent8_abi_cxx11_._M_dataplus._M_p,
                      indent8_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"shelloffsets[n] = shelloffsets[n-1] + 1;\n",0x29);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent8_abi_cxx11_._M_dataplus._M_p,
                      indent8_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"lastoffset++;\n",0xe);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent8_abi_cxx11_._M_dataplus._M_p,
                      indent8_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"nprim_icd += Q.nprim12[cd + (++icd)];\n",0x26);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent7_abi_cxx11_._M_dataplus._M_p,
                      indent7_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}\n",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent7_abi_cxx11_._M_dataplus._M_p,
                      indent7_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"else\n",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent8_abi_cxx11_._M_dataplus._M_p,
                      indent8_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"shelloffsets[n] = shelloffsets[n-1];\n",0x25);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent7_abi_cxx11_._M_dataplus._M_p,
                      indent7_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"iprimcd++;\n",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent6_abi_cxx11_._M_dataplus._M_p,
                      indent6_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}\n",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}\n",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"else\n",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent6_abi_cxx11_._M_dataplus._M_p,
                      indent6_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"iprimcd += SIMINT_SIMD_LEN;\n\n",0x1d);
  return;
}

Assistant:

void OSTEI_Writer::WriteShellOffsets(void) const
{
    os_ << indent5 << "// calculate the shell offsets\n";
    os_ << indent5 << "// these are the offset from the shell pointed to by cd\n";
    os_ << indent5 << "// for each element\n";
    os_ << indent5 << "int shelloffsets[SIMINT_SIMD_LEN] = {0};\n";
    os_ << indent5 << "int lastoffset = 0;\n";
    os_ << indent5 << "const int nlane = ( ((j + SIMINT_SIMD_LEN) < jend) ? SIMINT_SIMD_LEN : (jend - j));\n";
    os_ << "\n";
    os_ << indent5 << "if((iprimcd + SIMINT_SIMD_LEN) >= nprim_icd)\n";
    os_ << indent5 << "{\n";

    os_ << indent6 << "// Handle if the first element of the vector is a new shell\n";
    os_ << indent6 << "if(iprimcd >= nprim_icd && ((icd+1) < nshellbatch))\n";
    os_ << indent6 << "{\n";
    os_ << indent7 << "nprim_icd += Q.nprim12[cd + (++icd)];\n";

    for(const auto &it : hrr_writer_.Algo().TopAM())
        os_ << indent7 << PrimPtrName(it) << " += " << NCART(it) << ";\n";

    os_ << indent6 << "}\n";
    os_ << indent6 << "iprimcd++;\n";

    os_ << indent6 << "for(n = 1; n < SIMINT_SIMD_LEN; ++n)\n";
    os_ << indent6 << "{\n";
    os_ << indent7 << "if(iprimcd >= nprim_icd && ((icd+1) < nshellbatch))\n";
    os_ << indent7 << "{\n";
    os_ << indent8 << "shelloffsets[n] = shelloffsets[n-1] + 1;\n";
    os_ << indent8 << "lastoffset++;\n";
    os_ << indent8 << "nprim_icd += Q.nprim12[cd + (++icd)];\n";
    os_ << indent7 << "}\n";
    os_ << indent7 << "else\n";
    os_ << indent8 << "shelloffsets[n] = shelloffsets[n-1];\n";
    os_ << indent7 << "iprimcd++;\n";
    os_ << indent6 << "}\n";
    os_ << indent5 << "}\n";
    os_ << indent5 << "else\n";
    os_ << indent6 << "iprimcd += SIMINT_SIMD_LEN;\n\n";
}